

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O3

void __thiscall btCollisionWorldImporter::deleteAllData(btCollisionWorldImporter *this)

{
  btCollisionWorld *pbVar1;
  btCollisionShape *pbVar2;
  btCollisionShape **ptr;
  btOptimizedBvh *pbVar3;
  btOptimizedBvh **ptr_00;
  btTriangleInfoMap *pbVar4;
  btTriangleInfoMap **ptr_01;
  btTriangleIndexVertexArray *pbVar5;
  btTriangleIndexVertexArray **ptr_02;
  char *pcVar6;
  char **ptr_03;
  btStridingMeshInterfaceData *pbVar7;
  btMeshPartData *pbVar8;
  void *pvVar9;
  btStridingMeshInterfaceData **ptr_04;
  int **ptr_05;
  short **ptr_06;
  uchar **ptr_07;
  btVector3FloatData **ptr_08;
  btVector3DoubleData **ptr_09;
  int iVar10;
  btCollisionObject **ppbVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  if (0 < (this->m_allocatedCollisionObjects).m_size) {
    lVar14 = 0;
    do {
      pbVar1 = this->m_collisionWorld;
      ppbVar11 = (this->m_allocatedCollisionObjects).m_data;
      if (pbVar1 != (btCollisionWorld *)0x0) {
        (*pbVar1->_vptr_btCollisionWorld[10])(pbVar1,ppbVar11[lVar14]);
        ppbVar11 = (this->m_allocatedCollisionObjects).m_data;
      }
      if (ppbVar11[lVar14] != (btCollisionObject *)0x0) {
        (*ppbVar11[lVar14]->_vptr_btCollisionObject[1])();
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_allocatedCollisionObjects).m_size);
  }
  ppbVar11 = (this->m_allocatedCollisionObjects).m_data;
  if ((ppbVar11 != (btCollisionObject **)0x0) &&
     ((this->m_allocatedCollisionObjects).m_ownsMemory == true)) {
    btAlignedFreeInternal(ppbVar11);
  }
  (this->m_allocatedCollisionObjects).m_ownsMemory = true;
  (this->m_allocatedCollisionObjects).m_data = (btCollisionObject **)0x0;
  (this->m_allocatedCollisionObjects).m_size = 0;
  (this->m_allocatedCollisionObjects).m_capacity = 0;
  iVar10 = (this->m_allocatedCollisionShapes).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pbVar2 = (this->m_allocatedCollisionShapes).m_data[lVar14];
      if (pbVar2 != (btCollisionShape *)0x0) {
        (*pbVar2->_vptr_btCollisionShape[1])();
        iVar10 = (this->m_allocatedCollisionShapes).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr = (this->m_allocatedCollisionShapes).m_data;
  if ((ptr != (btCollisionShape **)0x0) && ((this->m_allocatedCollisionShapes).m_ownsMemory == true)
     ) {
    btAlignedFreeInternal(ptr);
  }
  (this->m_allocatedCollisionShapes).m_ownsMemory = true;
  (this->m_allocatedCollisionShapes).m_data = (btCollisionShape **)0x0;
  (this->m_allocatedCollisionShapes).m_size = 0;
  (this->m_allocatedCollisionShapes).m_capacity = 0;
  iVar10 = (this->m_allocatedBvhs).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pbVar3 = (this->m_allocatedBvhs).m_data[lVar14];
      if (pbVar3 != (btOptimizedBvh *)0x0) {
        (*(pbVar3->super_btQuantizedBvh)._vptr_btQuantizedBvh[1])();
        iVar10 = (this->m_allocatedBvhs).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr_00 = (this->m_allocatedBvhs).m_data;
  if ((ptr_00 != (btOptimizedBvh **)0x0) && ((this->m_allocatedBvhs).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_00);
  }
  (this->m_allocatedBvhs).m_ownsMemory = true;
  (this->m_allocatedBvhs).m_data = (btOptimizedBvh **)0x0;
  (this->m_allocatedBvhs).m_size = 0;
  (this->m_allocatedBvhs).m_capacity = 0;
  iVar10 = (this->m_allocatedTriangleInfoMaps).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pbVar4 = (this->m_allocatedTriangleInfoMaps).m_data[lVar14];
      if (pbVar4 != (btTriangleInfoMap *)0x0) {
        (*pbVar4->_vptr_btTriangleInfoMap[1])();
        iVar10 = (this->m_allocatedTriangleInfoMaps).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr_01 = (this->m_allocatedTriangleInfoMaps).m_data;
  if ((ptr_01 != (btTriangleInfoMap **)0x0) &&
     ((this->m_allocatedTriangleInfoMaps).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_01);
  }
  (this->m_allocatedTriangleInfoMaps).m_ownsMemory = true;
  (this->m_allocatedTriangleInfoMaps).m_data = (btTriangleInfoMap **)0x0;
  (this->m_allocatedTriangleInfoMaps).m_size = 0;
  (this->m_allocatedTriangleInfoMaps).m_capacity = 0;
  iVar10 = (this->m_allocatedTriangleIndexArrays).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pbVar5 = (this->m_allocatedTriangleIndexArrays).m_data[lVar14];
      if (pbVar5 != (btTriangleIndexVertexArray *)0x0) {
        (*(pbVar5->super_btStridingMeshInterface)._vptr_btStridingMeshInterface[1])();
        iVar10 = (this->m_allocatedTriangleIndexArrays).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr_02 = (this->m_allocatedTriangleIndexArrays).m_data;
  if ((ptr_02 != (btTriangleIndexVertexArray **)0x0) &&
     ((this->m_allocatedTriangleIndexArrays).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_02);
  }
  (this->m_allocatedTriangleIndexArrays).m_ownsMemory = true;
  (this->m_allocatedTriangleIndexArrays).m_data = (btTriangleIndexVertexArray **)0x0;
  (this->m_allocatedTriangleIndexArrays).m_size = 0;
  (this->m_allocatedTriangleIndexArrays).m_capacity = 0;
  iVar10 = (this->m_allocatedNames).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pcVar6 = (this->m_allocatedNames).m_data[lVar14];
      if (pcVar6 != (char *)0x0) {
        operator_delete__(pcVar6);
        iVar10 = (this->m_allocatedNames).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr_03 = (this->m_allocatedNames).m_data;
  if ((ptr_03 != (char **)0x0) && ((this->m_allocatedNames).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_03);
  }
  (this->m_allocatedNames).m_ownsMemory = true;
  (this->m_allocatedNames).m_data = (char **)0x0;
  (this->m_allocatedNames).m_size = 0;
  (this->m_allocatedNames).m_capacity = 0;
  if (0 < (this->m_allocatedbtStridingMeshInterfaceDatas).m_size) {
    lVar14 = 0;
    do {
      pbVar7 = (this->m_allocatedbtStridingMeshInterfaceDatas).m_data[lVar14];
      if (0 < pbVar7->m_numMeshParts) {
        lVar12 = 0x28;
        lVar13 = 0;
        do {
          pbVar8 = pbVar7->m_meshPartsPtr;
          pvVar9 = *(void **)((long)pbVar8 + lVar12 + -0x28);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)pbVar8 + lVar12 + -0x20);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)pbVar8 + lVar12 + -0x18);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)pbVar8 + lVar12 + -0x10);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)&pbVar8->m_vertices3f + lVar12);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)pbVar8 + lVar12 + -8);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          lVar13 = lVar13 + 1;
          lVar12 = lVar12 + 0x38;
        } while (lVar13 < pbVar7->m_numMeshParts);
      }
      if (pbVar7->m_meshPartsPtr != (btMeshPartData *)0x0) {
        operator_delete__(pbVar7->m_meshPartsPtr);
      }
      operator_delete(pbVar7);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_allocatedbtStridingMeshInterfaceDatas).m_size);
  }
  ptr_04 = (this->m_allocatedbtStridingMeshInterfaceDatas).m_data;
  if ((ptr_04 != (btStridingMeshInterfaceData **)0x0) &&
     ((this->m_allocatedbtStridingMeshInterfaceDatas).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_04);
  }
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_ownsMemory = true;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_data = (btStridingMeshInterfaceData **)0x0;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_size = 0;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_capacity = 0;
  if (0 < (this->m_indexArrays).m_size) {
    lVar14 = 0;
    do {
      btAlignedFreeInternal((this->m_indexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_indexArrays).m_size);
  }
  ptr_05 = (this->m_indexArrays).m_data;
  if ((ptr_05 != (int **)0x0) && ((this->m_indexArrays).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_05);
  }
  (this->m_indexArrays).m_ownsMemory = true;
  (this->m_indexArrays).m_data = (int **)0x0;
  (this->m_indexArrays).m_size = 0;
  (this->m_indexArrays).m_capacity = 0;
  if (0 < (this->m_shortIndexArrays).m_size) {
    lVar14 = 0;
    do {
      btAlignedFreeInternal((this->m_shortIndexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_shortIndexArrays).m_size);
  }
  ptr_06 = (this->m_shortIndexArrays).m_data;
  if ((ptr_06 != (short **)0x0) && ((this->m_shortIndexArrays).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_06);
  }
  (this->m_shortIndexArrays).m_ownsMemory = true;
  (this->m_shortIndexArrays).m_data = (short **)0x0;
  (this->m_shortIndexArrays).m_size = 0;
  (this->m_shortIndexArrays).m_capacity = 0;
  if (0 < (this->m_charIndexArrays).m_size) {
    lVar14 = 0;
    do {
      btAlignedFreeInternal((this->m_charIndexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_charIndexArrays).m_size);
  }
  ptr_07 = (this->m_charIndexArrays).m_data;
  if ((ptr_07 != (uchar **)0x0) && ((this->m_charIndexArrays).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_07);
  }
  (this->m_charIndexArrays).m_ownsMemory = true;
  (this->m_charIndexArrays).m_data = (uchar **)0x0;
  (this->m_charIndexArrays).m_size = 0;
  (this->m_charIndexArrays).m_capacity = 0;
  if (0 < (this->m_floatVertexArrays).m_size) {
    lVar14 = 0;
    do {
      btAlignedFreeInternal((this->m_floatVertexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_floatVertexArrays).m_size);
  }
  ptr_08 = (this->m_floatVertexArrays).m_data;
  if ((ptr_08 != (btVector3FloatData **)0x0) && ((this->m_floatVertexArrays).m_ownsMemory == true))
  {
    btAlignedFreeInternal(ptr_08);
  }
  (this->m_floatVertexArrays).m_ownsMemory = true;
  (this->m_floatVertexArrays).m_data = (btVector3FloatData **)0x0;
  (this->m_floatVertexArrays).m_size = 0;
  (this->m_floatVertexArrays).m_capacity = 0;
  if (0 < (this->m_doubleVertexArrays).m_size) {
    lVar14 = 0;
    do {
      btAlignedFreeInternal((this->m_doubleVertexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_doubleVertexArrays).m_size);
  }
  ptr_09 = (this->m_doubleVertexArrays).m_data;
  if ((ptr_09 != (btVector3DoubleData **)0x0) && ((this->m_doubleVertexArrays).m_ownsMemory == true)
     ) {
    btAlignedFreeInternal(ptr_09);
  }
  (this->m_doubleVertexArrays).m_ownsMemory = true;
  (this->m_doubleVertexArrays).m_data = (btVector3DoubleData **)0x0;
  (this->m_doubleVertexArrays).m_size = 0;
  (this->m_doubleVertexArrays).m_capacity = 0;
  return;
}

Assistant:

void btCollisionWorldImporter::deleteAllData()
{
	int i;

	for (i=0;i<m_allocatedCollisionObjects.size();i++)
	{
		if(m_collisionWorld)
			m_collisionWorld->removeCollisionObject(m_allocatedCollisionObjects[i]);
		delete m_allocatedCollisionObjects[i];
	}

	m_allocatedCollisionObjects.clear();


	for (i=0;i<m_allocatedCollisionShapes.size();i++)
	{
		delete m_allocatedCollisionShapes[i];
	}
	m_allocatedCollisionShapes.clear();


	for (i=0;i<m_allocatedBvhs.size();i++)
	{
		delete m_allocatedBvhs[i];
	}
	m_allocatedBvhs.clear();

	for (i=0;i<m_allocatedTriangleInfoMaps.size();i++)
	{
		delete m_allocatedTriangleInfoMaps[i];
	}
	m_allocatedTriangleInfoMaps.clear();
	for (i=0;i<m_allocatedTriangleIndexArrays.size();i++)
	{
		delete m_allocatedTriangleIndexArrays[i];
	}
	m_allocatedTriangleIndexArrays.clear();
	for (i=0;i<m_allocatedNames.size();i++)
	{
		delete[] m_allocatedNames[i];
	}
	m_allocatedNames.clear();

	for (i=0;i<m_allocatedbtStridingMeshInterfaceDatas.size();i++)
	{
		btStridingMeshInterfaceData* curData = m_allocatedbtStridingMeshInterfaceDatas[i];

		for(int a = 0;a < curData->m_numMeshParts;a++)
		{
			btMeshPartData* curPart = &curData->m_meshPartsPtr[a];
			if(curPart->m_vertices3f)
				delete [] curPart->m_vertices3f;

			if(curPart->m_vertices3d)
				delete [] curPart->m_vertices3d;

			if(curPart->m_indices32)
				delete [] curPart->m_indices32;

			if(curPart->m_3indices16)
				delete [] curPart->m_3indices16;

			if(curPart->m_indices16)
				delete [] curPart->m_indices16;

			if (curPart->m_3indices8)
				delete [] curPart->m_3indices8;

		}
		delete [] curData->m_meshPartsPtr;
		delete curData;
	}
	m_allocatedbtStridingMeshInterfaceDatas.clear();

	for (i=0;i<m_indexArrays.size();i++)
	{
		btAlignedFree(m_indexArrays[i]);
	}
  m_indexArrays.clear();

	for (i=0;i<m_shortIndexArrays.size();i++)
	{
		btAlignedFree(m_shortIndexArrays[i]);
	}
  m_shortIndexArrays.clear();

	for (i=0;i<m_charIndexArrays.size();i++)
	{
		btAlignedFree(m_charIndexArrays[i]);
	}
  m_charIndexArrays.clear();

	for (i=0;i<m_floatVertexArrays.size();i++)
	{
		btAlignedFree(m_floatVertexArrays[i]);
	}
  m_floatVertexArrays.clear();

	for (i=0;i<m_doubleVertexArrays.size();i++)
	{
		btAlignedFree(m_doubleVertexArrays[i]);
	}
   m_doubleVertexArrays.clear();


}